

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O2

uint32_t elf_findsymidx(SymTabList *sl,char *name,uint16_t shndx)

{
  SymbolNode *pSVar1;
  int iVar2;
  unsigned_long uVar3;
  SymbolNode **ppSVar4;
  
  ppSVar4 = sl->hashtab;
  uVar3 = elf_hash(name);
  ppSVar4 = ppSVar4 + uVar3 % sl->htabsize;
  while( true ) {
    pSVar1 = *ppSVar4;
    if (pSVar1 == (SymbolNode *)0x0) {
      return 0;
    }
    iVar2 = strcmp(name,pSVar1->name);
    if ((iVar2 == 0) && (pSVar1->shndx == shndx)) break;
    ppSVar4 = &pSVar1->hashchain;
  }
  return pSVar1->index;
}

Assistant:

static uint32_t elf_findsymidx(struct SymTabList *sl,const char *name,
                               uint16_t shndx)
/* find an ELF symbol by its name and shndx */
/* return its symbol table index, index=0 means 'not found' */
{
  struct SymbolNode **chain = &sl->hashtab[elf_hash(name) % sl->htabsize];
  struct SymbolNode *sym;

  while (sym = *chain) {
    if (!strcmp(name,sym->name) && sym->shndx==shndx)
      return sym->index;
    chain = &sym->hashchain;
  }
  return 0;
}